

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O1

int bassigncstr(bstring a,char *str)

{
  ulong __n;
  uchar uVar1;
  int iVar2;
  size_t sVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  
  iVar4 = -1;
  if ((((a != (bstring)0x0) && (a->data != (uchar *)0x0)) && (-1 < a->slen && a->slen <= a->mlen))
     && (str != (char *)0x0 && a->mlen != 0)) {
    if (a->mlen < 1) {
      uVar6 = 0;
    }
    else {
      uVar6 = 0;
      do {
        uVar1 = str[uVar6];
        a->data[uVar6] = uVar1;
        if (uVar1 == '\0') goto LAB_0014f443;
        uVar6 = uVar6 + 1;
      } while ((long)uVar6 < (long)a->mlen);
    }
    a->slen = (int)uVar6;
    uVar5 = uVar6 & 0xffffffff;
    sVar3 = strlen(str + uVar5);
    __n = sVar3 + 1;
    if (__n <= (uVar5 ^ 0x7fffffff)) {
      iVar2 = balloc(a,(int)uVar6 + (int)sVar3 + 1);
      if (-1 < iVar2) {
        if (__n != 0) {
          memmove(a->data + uVar5,str + uVar5,__n);
        }
        uVar6 = (ulong)(uint)((int)sVar3 + a->slen);
LAB_0014f443:
        a->slen = (int)uVar6;
        iVar4 = 0;
      }
    }
  }
  return iVar4;
}

Assistant:

int bassigncstr (bstring a, const char * str) {
int i;
size_t len;
	if (a == NULL || a->data == NULL || a->mlen < a->slen ||
	    a->slen < 0 || a->mlen == 0 || NULL == str)
		return BSTR_ERR;

	for (i=0; i < a->mlen; i++) {
		if ('\0' == (a->data[i] = str[i])) {
			a->slen = i;
			return BSTR_OK;
		}
	}

	a->slen = i;
	len = strlen (str + i);
	if (len + 1 > (size_t) INT_MAX - i ||
	    0 > balloc (a, (int) (i + len + 1))) return BSTR_ERR;
	bBlockCopy (a->data + i, str + i, (size_t) len + 1);
	a->slen += (int) len;
	return BSTR_OK;
}